

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O2

QSize __thiscall QTabBar::minimumTabSizeHint(QTabBar *this,int index)

{
  byte *pbVar1;
  long lVar2;
  QString *this_00;
  qsizetype qVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  QSize QVar6;
  QStringBuilder<QStringBuilder<QStringView,_const_QLatin1String_&>,_QStringView> *this_01;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_a8;
  QArrayDataPointer<char16_t> local_90;
  QStringBuilder<QStringBuilder<QStringView,_const_QLatin1String_&>,_QStringView> local_78;
  QStringBuilder<QStringBuilder<QStringView,_const_QLatin1String_&>,_QStringView> local_48;
  
  local_48.b.m_data = *(storage_type_conflict **)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QWidget).field_0x8;
  this_00 = *(QString **)(*(long *)(lVar2 + 0x2e0) + (long)index * 8);
  local_90.d = (this_00->d).d;
  local_90.ptr = (this_00->d).ptr;
  local_90.size = (this_00->d).size;
  if (local_90.d != (Data *)0x0) {
    LOCK();
    ((local_90.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_90.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if ((ulong)local_90.size < (QLatin1String *)0x4) {
    local_a8.d = local_90.d;
    local_a8.ptr = local_90.ptr;
    local_a8.size = local_90.size;
    if (local_90.d != (Data *)0x0) {
      LOCK();
      ((local_90.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_90.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    goto switchD_00450127_default;
  }
  local_a8.d = (Data *)0x0;
  local_a8.ptr = (char16_t *)0x0;
  local_a8.size = 0;
  switch(*(undefined4 *)(lVar2 + 0x2ac)) {
  case 0:
    local_48.a.b = (QLatin1String *)
                   (local_90.ptr +
                   (long)((long)&((QLatin1String *)(local_90.size + -0x10))->m_data + 6));
    local_48.a.a.m_size = (qsizetype)computeElidedText(Qt::TextElideMode,QString_const&)::Ellipses;
    local_48.a.a.m_data = (char16_t *)0x2;
    this_01 = &local_78;
    QStringBuilder<const_QLatin1String_&,_QStringView>::convertTo<QString>
              ((QString *)this_01,(QStringBuilder<const_QLatin1String_&,_QStringView> *)&local_48);
    break;
  case 1:
    local_48.a.a.m_size = 2;
    local_48.a.b = (QLatin1String *)computeElidedText(Qt::TextElideMode,QString_const&)::Ellipses;
    this_01 = &local_78;
    local_48.a.a.m_data = local_90.ptr;
    QStringBuilder<QStringView,_const_QLatin1String_&>::convertTo<QString>
              ((QString *)this_01,&local_48.a);
    break;
  case 2:
    local_78.b.m_data =
         local_90.ptr + (long)((long)&((QLatin1String *)(local_90.size + -0x10))->m_data + 7);
    local_78.a.a.m_size = 1;
    local_78.a.b = (QLatin1String *)computeElidedText(Qt::TextElideMode,QString_const&)::Ellipses;
    local_78.b.m_size = 1;
    this_01 = &local_48;
    local_78.a.a.m_data = local_90.ptr;
    QStringBuilder<QStringBuilder<QStringView,_const_QLatin1String_&>,_QStringView>::
    convertTo<QString>((QString *)this_01,&local_78);
    break;
  case 3:
    QString::operator=((QString *)&local_a8,(QString *)&local_90);
  default:
    goto switchD_00450127_default;
  }
  local_a8.d = (Data *)(this_01->a).a.m_size;
  local_a8.ptr = (this_01->a).a.m_data;
  (this_01->a).a.m_size = 0;
  (this_01->a).a.m_data = (storage_type_conflict *)0x0;
  local_a8.size = (qsizetype)(this_01->a).b;
  (this_01->a).b = (QLatin1String *)0x0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this_01);
switchD_00450127_default:
  pDVar4 = (this_00->d).d;
  pcVar5 = (this_00->d).ptr;
  (this_00->d).d = local_a8.d;
  (this_00->d).ptr = local_a8.ptr;
  qVar3 = (this_00->d).size;
  (this_00->d).size = local_a8.size;
  local_a8.d = pDVar4;
  local_a8.ptr = pcVar5;
  local_a8.size = qVar3;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  pbVar1 = (byte *)((long)&this_00[9].d.ptr + 4);
  *pbVar1 = *pbVar1 | 4;
  QVar6 = (QSize)(**(code **)(*(long *)&this->super_QWidget + 0x1a0))(this,index);
  QString::operator=(this_00,(QString *)&local_90);
  pbVar1 = (byte *)((long)&this_00[9].d.ptr + 4);
  *pbVar1 = *pbVar1 & 0xfb;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
  if (*(storage_type_conflict **)(in_FS_OFFSET + 0x28) != local_48.b.m_data) {
    __stack_chk_fail();
  }
  return QVar6;
}

Assistant:

QSize QTabBar::minimumTabSizeHint(int index) const
{
    Q_D(const QTabBar);
    QTabBarPrivate::Tab *tab = d->tabList.at(index);
    QString oldText = tab->text;
    tab->text = computeElidedText(d->elideMode, oldText);
    tab->measuringMinimum = true;
    QSize size = tabSizeHint(index);
    tab->text = oldText;
    tab->measuringMinimum = false;
    return size;
}